

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

EntryType * __thiscall
JsUtil::
BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  SimpleDictionaryEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport> *pSVar2;
  offset_in_ArenaAllocator_to_subr extraout_RDX;
  offset_in_ArenaAllocator_to_subr extraout_RDX_00;
  ArenaAllocator *local_70;
  offset_in_ArenaAllocator_to_subr local_68;
  TrackAllocData local_40;
  byte local_15;
  int local_14;
  bool zeroAllocate_local;
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_10;
  int size_local;
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  local_15 = zeroAllocate;
  local_14 = size;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &SimpleDictionaryEntry<int,Js::AsmJsModuleCompiler::AsmJsModuleExport>::typeinfo,0,
             (long)size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x453);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_40);
  if ((local_15 & 1) == 0) {
    local_70 = (ArenaAllocator *)
               Memory::
               TypeAllocatorFunc<Memory::ArenaAllocator,_Js::AsmJsModuleCompiler::AsmJsModuleExport>
               ::GetAllocFunc();
    local_68 = extraout_RDX_00;
  }
  else {
    local_70 = (ArenaAllocator *)
               Memory::
               TypeAllocatorFunc<Memory::ArenaAllocator,_Js::AsmJsModuleCompiler::AsmJsModuleExport>
               ::GetAllocZeroFunc();
    local_68 = extraout_RDX;
  }
  pSVar2 = Memory::
           AllocateArray<Memory::ArenaAllocator,JsUtil::SimpleDictionaryEntry<int,Js::AsmJsModuleCompiler::AsmJsModuleExport>,false>
                     ((Memory *)pAVar1,local_70,local_68,(long)local_14);
  return pSVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }